

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O3

int Vec_IntDoubleWidth(Vec_Int_t *p,int nWords)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  size_t __nmemb;
  
  iVar1 = p->nSize;
  __nmemb = (long)iVar1 * 2;
  piVar3 = (int *)calloc(__nmemb,4);
  if (iVar1 % nWords == 0) {
    if (0 < (int)((long)iVar1 / (long)nWords)) {
      lVar4 = 0;
      iVar5 = 0;
      uVar6 = 0;
      do {
        if (0 < nWords) {
          piVar2 = p->pArray;
          uVar7 = 0;
          do {
            piVar3[(long)iVar5 + uVar7] = *(int *)((long)piVar2 + uVar7 * 4 + lVar4);
            uVar7 = uVar7 + 1;
          } while ((uint)nWords != uVar7);
        }
        uVar6 = uVar6 + 1;
        iVar5 = iVar5 + nWords * 2;
        lVar4 = lVar4 + (long)nWords * 4;
      } while (uVar6 != ((long)iVar1 / (long)nWords & 0xffffffffU));
    }
    if (p->pArray != (int *)0x0) {
      free(p->pArray);
      __nmemb = (size_t)(uint)(p->nSize * 2);
    }
    p->pArray = piVar3;
    p->nSize = (int)__nmemb;
    p->nCap = (int)__nmemb;
    return nWords * 2;
  }
  __assert_fail("Vec_IntSize(p) % nWords == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                ,0xf5,"int Vec_IntDoubleWidth(Vec_Int_t *, int)");
}

Assistant:

int Vec_IntDoubleWidth( Vec_Int_t * p, int nWords )
{
    int * pArray = ABC_CALLOC( int, Vec_IntSize(p) * 2 );
    int i, w, nObjs = Vec_IntSize(p) / nWords;
    assert( Vec_IntSize(p) % nWords == 0 );
    for ( i = 0; i < nObjs; i++ )
        for ( w = 0; w < nWords; w++ )
            pArray[2 * nWords * i + w] = p->pArray[nWords * i + w];
    ABC_FREE( p->pArray );
    p->pArray = pArray;
    p->nSize *= 2;
    p->nCap = p->nSize;
    return 2 * nWords;
}